

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O3

void __thiscall DSDcc::Locator::setIndexes(Locator *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  
  fVar1 = this->m_lat * 0.1 + 9.0;
  this->m_lat_index1 = (int)fVar1;
  fVar2 = (float)(int)fVar1 * -10.0 + this->m_lat + 90.0;
  iVar4 = (int)(this->m_lon * 0.05 + 9.0);
  fVar1 = (float)iVar4 * -20.0 + this->m_lon + 180.0;
  this->m_lat_index2 = (int)fVar2;
  iVar3 = (int)(fVar1 * 0.5);
  this->m_lon_index2 = iVar3;
  this->m_lat_index3 = (int)((fVar2 - (float)(int)fVar2) * 24.0);
  this->m_lon_index1 = iVar4;
  this->m_lon_index3 = (int)((fVar1 - (float)(iVar3 * 2)) * 12.0);
  return;
}

Assistant:

void Locator::setIndexes()
{
    float lat_rem, lon_rem;

    m_lat_index1 = int((m_lat + 90.0)  / 10.0);
    m_lon_index1 = int((m_lon + 180.0) / 20.0);
    lat_rem = m_lat + 90.0 - (m_lat_index1 * 10.0);
    lon_rem = m_lon + 180.0 - (m_lon_index1 * 20.0);
    m_lat_index2 = int(lat_rem);
    m_lon_index2 = int(lon_rem / 2.0);
    lat_rem = lat_rem - m_lat_index2;
    lon_rem = lon_rem - (m_lon_index2 * 2);
    m_lat_index3 = int(lat_rem * 24.0);
    m_lon_index3 = int(lon_rem * 12.0);
}